

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall flatbuffers::rust::RustGenerator::GenEnum(RustGenerator *this,EnumDef *enum_def)

{
  EnumDef *pEVar1;
  bool bVar2;
  Value *pVVar3;
  char *__s;
  size_t t;
  bool local_142a;
  allocator<char> local_1429;
  string local_1428;
  allocator<char> local_1401;
  string local_1400;
  string local_13e0;
  allocator<char> local_13b9;
  string local_13b8;
  allocator<char> local_1391;
  string local_1390;
  allocator<char> local_1369;
  string local_1368;
  allocator<char> local_1341;
  string local_1340;
  allocator<char> local_1319;
  string local_1318;
  allocator<char> local_12f1;
  string local_12f0;
  allocator<char> local_12c9;
  string local_12c8;
  allocator<char> local_12a1;
  string local_12a0;
  allocator<char> local_1279;
  string local_1278;
  allocator<char> local_1251;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  allocator<char> local_11b1;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  allocator<char> local_1111;
  string local_1110;
  allocator<char> local_10e9;
  string local_10e8;
  allocator<char> local_10c1;
  string local_10c0;
  allocator<char> local_1099;
  string local_1098;
  allocator<char> local_1071;
  string local_1070;
  allocator<char> local_1049;
  string local_1048;
  allocator<char> local_1021;
  string local_1020;
  allocator<char> local_ff9;
  string local_ff8;
  allocator<char> local_fd1;
  string local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  allocator<char> local_f81;
  string local_f80;
  allocator<char> local_f59;
  string local_f58;
  allocator<char> local_f31;
  string local_f30;
  allocator<char> local_f09;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  allocator<char> local_e41;
  string local_e40;
  allocator<char> local_e19;
  string local_e18;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0;
  allocator<char> local_d79;
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  allocator<char> local_d29;
  string local_d28;
  allocator<char> local_d01;
  string local_d00;
  allocator<char> local_cd9;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  allocator<char> local_c89;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  allocator<char> local_c11;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  allocator<char> local_bc1;
  string local_bc0;
  allocator<char> local_b99;
  string local_b98;
  allocator<char> local_b71;
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  allocator<char> local_af9;
  string local_af8;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  allocator<char> local_a31;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  anon_class_8_1_8991fb9c local_8d0;
  function<void_()> local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  anon_class_8_1_8991fb9c local_808;
  function<void_()> local_800;
  allocator<char> local_7d9;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  anon_class_8_1_8991fb9c local_740;
  function<void_(const_flatbuffers::EnumVal_&)> local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  anon_class_16_2_b77d0602 local_600;
  function<void_(const_flatbuffers::EnumVal_&)> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  allocator<char> local_589;
  string local_588;
  string local_568;
  undefined1 local_548 [8];
  string num_fields;
  string local_520;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  string local_4b8;
  allocator<char> local_491;
  string local_490 [8];
  string deprecation_warning;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  anon_class_8_1_8991fb9c local_358;
  function<void_(const_flatbuffers::EnumVal_&)> local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  EnumVal *local_1d8;
  EnumVal *maxv;
  EnumVal *minv;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  allocator<char> local_159;
  string local_158;
  string local_138;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  EnumDef *pEStack_18;
  bool is_private;
  EnumDef *enum_def_local;
  RustGenerator *this_local;
  
  local_42 = 0;
  local_55 = 0;
  local_142a = false;
  pEStack_18 = enum_def;
  enum_def_local = (EnumDef *)this;
  if (((((this->super_BaseGenerator).parser_)->opts).no_leak_private_annotations & 1U) != 0) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"private",&local_41);
    local_55 = 1;
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(enum_def->super_Definition).attributes,&local_40);
    local_142a = pVVar3 != (Value *)0x0;
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  local_19 = local_142a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"ACCESS_TYPE",&local_79);
  __s = "pub";
  if ((local_19 & 1) != 0) {
    __s = "pub(crate)";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,__s,&local_a1);
  CodeWriter::SetValue(&this->code_,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"ENUM_TY",&local_c9);
  IdlNamer::Type_abi_cxx11_(&local_f0,&this->namer_,pEStack_18);
  CodeWriter::SetValue(&this->code_,&local_c8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"BASE_TYPE",&local_111);
  GetEnumTypeForDecl_abi_cxx11_(&local_138,this,&pEStack_18->underlying_type);
  CodeWriter::SetValue(&this->code_,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"ENUM_NAMESPACE",&local_159);
  Namer::Namespace(&local_180,&(this->namer_).super_Namer,(string *)pEStack_18);
  CodeWriter::SetValue(&this->code_,&local_158,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"ENUM_CONSTANT",&local_1a1);
  Namer::Constant((string *)&minv,&(this->namer_).super_Namer,(string *)pEStack_18);
  CodeWriter::SetValue(&this->code_,&local_1a0,(string *)&minv);
  std::__cxx11::string::~string((string *)&minv);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  maxv = EnumDef::MinValue(pEStack_18);
  local_1d8 = EnumDef::MaxValue(pEStack_18);
  if (maxv == (EnumVal *)0x0 || local_1d8 == (EnumVal *)0x0) {
    __assert_fail("minv && maxv",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x2cd,"void flatbuffers::rust::RustGenerator::GenEnum(const EnumDef &)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"ENUM_MIN_BASE_VALUE",&local_1f9);
  EnumDef::ToString_abi_cxx11_(&local_220,pEStack_18,maxv);
  CodeWriter::SetValue(&this->code_,&local_1f8,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"ENUM_MAX_BASE_VALUE",&local_241);
  EnumDef::ToString_abi_cxx11_(&local_268,pEStack_18,local_1d8);
  CodeWriter::SetValue(&this->code_,&local_240,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  bVar2 = anon_unknown_26::IsBitFlagsEnum(pEStack_18);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"#[allow(non_upper_case_globals)]",&local_289);
    CodeWriter::operator+=(&this->code_,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"mod bitflags_{{ENUM_NAMESPACE}} {",&local_2b1);
    CodeWriter::operator+=(&this->code_,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"  flatbuffers::bitflags::bitflags! {",&local_2d9);
    CodeWriter::operator+=(&this->code_,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    GenComment(this,&(pEStack_18->super_Definition).doc_comment,"    ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"    #[derive(Default, Debug, Clone, Copy, PartialEq)]",
               &local_301);
    CodeWriter::operator+=(&this->code_,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"    {{ACCESS_TYPE}} struct {{ENUM_TY}}: {{BASE_TYPE}} {",
               &local_329);
    CodeWriter::operator+=(&this->code_,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    pEVar1 = pEStack_18;
    local_358.this = this;
    std::function<void(flatbuffers::EnumVal_const&)>::
    function<flatbuffers::rust::RustGenerator::GenEnum(flatbuffers::EnumDef_const&)::_lambda(flatbuffers::EnumVal_const&)_1_,void>
              ((function<void(flatbuffers::EnumVal_const&)> *)&local_350,&local_358);
    ForAllEnumValues1(this,pEVar1,&local_350);
    std::function<void_(const_flatbuffers::EnumVal_&)>::~function(&local_350);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"    }",&local_379);
    CodeWriter::operator+=(&this->code_,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"  }",&local_3a1);
    CodeWriter::operator+=(&this->code_,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"}",&local_3c9);
    CodeWriter::operator+=(&this->code_,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"pub use self::bitflags_{{ENUM_NAMESPACE}}::{{ENUM_TY}};",
               &local_3f1);
    CodeWriter::operator+=(&this->code_,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"",&local_419);
    CodeWriter::operator+=(&this->code_,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"INTO_BASE",&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"self.bits()",
               (allocator<char> *)(deprecation_warning.field_2._M_local_buf + 0xf));
    CodeWriter::SetValue(&this->code_,&local_440,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator
              ((allocator<char> *)(deprecation_warning.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_490,
               "#[deprecated(since = \"2.0.0\", note = \"Use associated constants instead. This will no longer be generated in 2021.\")]"
               ,&local_491);
    std::allocator<char>::~allocator(&local_491);
    std::__cxx11::string::string((string *)&local_4b8,local_490);
    CodeWriter::operator+=(&this->code_,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,
               "pub const ENUM_MIN_{{ENUM_CONSTANT}}: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};",
               &local_4d9);
    CodeWriter::operator+=(&this->code_,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::string((string *)&local_500,local_490);
    CodeWriter::operator+=(&this->code_,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,
               "pub const ENUM_MAX_{{ENUM_CONSTANT}}: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};",
               (allocator<char> *)(num_fields.field_2._M_local_buf + 0xf));
    CodeWriter::operator+=(&this->code_,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)(num_fields.field_2._M_local_buf + 0xf));
    t = EnumDef::size(pEStack_18);
    NumToString<unsigned_long>((string *)local_548,t);
    std::__cxx11::string::string((string *)&local_568,local_490);
    CodeWriter::operator+=(&this->code_,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,"#[allow(non_camel_case_types)]",&local_589);
    CodeWriter::operator+=(&this->code_,&local_588);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
    std::operator+(&local_5d0,"pub const ENUM_VALUES_{{ENUM_CONSTANT}}: [{{ENUM_TY}}; ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
    std::operator+(&local_5b0,&local_5d0,"] = [");
    CodeWriter::operator+=(&this->code_,&local_5b0);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_5d0);
    pEVar1 = pEStack_18;
    local_600.enum_def = pEStack_18;
    local_600.this = this;
    std::function<void(flatbuffers::EnumVal_const&)>::
    function<flatbuffers::rust::RustGenerator::GenEnum(flatbuffers::EnumDef_const&)::_lambda(flatbuffers::EnumVal_const&)_2_,void>
              ((function<void(flatbuffers::EnumVal_const&)> *)&local_5f0,&local_600);
    ForAllEnumValues1(this,pEVar1,&local_5f0);
    std::function<void_(const_flatbuffers::EnumVal_&)>::~function(&local_5f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"];",&local_621);
    CodeWriter::operator+=(&this->code_,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"",&local_649);
    CodeWriter::operator+=(&this->code_,&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    GenComment(this,&(pEStack_18->super_Definition).doc_comment,"");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,
               "#[derive(Clone, Copy, PartialEq, Eq, PartialOrd, Ord, Hash, Default)]",&local_671);
    CodeWriter::operator+=(&this->code_,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"#[repr(transparent)]",&local_699);
    CodeWriter::operator+=(&this->code_,&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator(&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,"{{ACCESS_TYPE}} struct {{ENUM_TY}}(pub {{BASE_TYPE}});",
               &local_6c1);
    CodeWriter::operator+=(&this->code_,&local_6c0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator(&local_6c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e8,"#[allow(non_upper_case_globals)]",&local_6e9);
    CodeWriter::operator+=(&this->code_,&local_6e8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"impl {{ENUM_TY}} {",&local_711);
    CodeWriter::operator+=(&this->code_,&local_710);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    pEVar1 = pEStack_18;
    local_740.this = this;
    std::function<void(flatbuffers::EnumVal_const&)>::
    function<flatbuffers::rust::RustGenerator::GenEnum(flatbuffers::EnumDef_const&)::_lambda(flatbuffers::EnumVal_const&)_3_,void>
              ((function<void(flatbuffers::EnumVal_const&)> *)&local_738,&local_740);
    ForAllEnumValues1(this,pEVar1,&local_738);
    std::function<void_(const_flatbuffers::EnumVal_&)>::~function(&local_738);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"",&local_761);
    CodeWriter::operator+=(&this->code_,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator(&local_761);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_788,"  pub const ENUM_MIN: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};"
               ,&local_789);
    CodeWriter::operator+=(&this->code_,&local_788);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,"  pub const ENUM_MAX: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};"
               ,&local_7b1);
    CodeWriter::operator+=(&this->code_,&local_7b0);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator(&local_7b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d8,"  pub const ENUM_VALUES: &\'static [Self] = &[",&local_7d9);
    CodeWriter::operator+=(&this->code_,&local_7d8);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator(&local_7d9);
    pEVar1 = pEStack_18;
    local_808.this = this;
    std::function<void()>::
    function<flatbuffers::rust::RustGenerator::GenEnum(flatbuffers::EnumDef_const&)::_lambda()_1_,void>
              ((function<void()> *)&local_800,&local_808);
    ForAllEnumValues(this,pEVar1,&local_800);
    std::function<void_()>::~function(&local_800);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"  ];",&local_829);
    CodeWriter::operator+=(&this->code_,&local_828);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,"  /// Returns the variant\'s name or \"\" if unknown.",
               &local_851);
    CodeWriter::operator+=(&this->code_,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator(&local_851);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_878,"  pub fn variant_name(self) -> Option<&\'static str> {",
               &local_879);
    CodeWriter::operator+=(&this->code_,&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::allocator<char>::~allocator(&local_879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a0,"    match self {",&local_8a1);
    CodeWriter::operator+=(&this->code_,&local_8a0);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::allocator<char>::~allocator(&local_8a1);
    pEVar1 = pEStack_18;
    local_8d0.this = this;
    std::function<void()>::
    function<flatbuffers::rust::RustGenerator::GenEnum(flatbuffers::EnumDef_const&)::_lambda()_2_,void>
              ((function<void()> *)&local_8c8,&local_8d0);
    ForAllEnumValues(this,pEVar1,&local_8c8);
    std::function<void_()>::~function(&local_8c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8f0,"      _ => None,",&local_8f1);
    CodeWriter::operator+=(&this->code_,&local_8f0);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::allocator<char>::~allocator(&local_8f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,"    }",&local_919);
    CodeWriter::operator+=(&this->code_,&local_918);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator(&local_919);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"  }",&local_941);
    CodeWriter::operator+=(&this->code_,&local_940);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator(&local_941);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"}",&local_969);
    CodeWriter::operator+=(&this->code_,&local_968);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator(&local_969);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"impl core::fmt::Debug for {{ENUM_TY}} {",&local_991);
    CodeWriter::operator+=(&this->code_,&local_990);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator(&local_991);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b8,
               "  fn fmt(&self, f: &mut core::fmt::Formatter) -> core::fmt::Result {",&local_9b9);
    CodeWriter::operator+=(&this->code_,&local_9b8);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator(&local_9b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9e0,"    if let Some(name) = self.variant_name() {",&local_9e1);
    CodeWriter::operator+=(&this->code_,&local_9e0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator(&local_9e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a08,"      f.write_str(name)",&local_a09);
    CodeWriter::operator+=(&this->code_,&local_a08);
    std::__cxx11::string::~string((string *)&local_a08);
    std::allocator<char>::~allocator(&local_a09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a30,"    } else {",&local_a31);
    CodeWriter::operator+=(&this->code_,&local_a30);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator(&local_a31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a58,"      f.write_fmt(format_args!(\"<UNKNOWN {:?}>\", self.0))",
               &local_a59);
    CodeWriter::operator+=(&this->code_,&local_a58);
    std::__cxx11::string::~string((string *)&local_a58);
    std::allocator<char>::~allocator(&local_a59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a80,"    }",&local_a81);
    CodeWriter::operator+=(&this->code_,&local_a80);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator(&local_a81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"  }",&local_aa9);
    CodeWriter::operator+=(&this->code_,&local_aa8);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::allocator<char>::~allocator(&local_aa9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad0,"}",&local_ad1);
    CodeWriter::operator+=(&this->code_,&local_ad0);
    std::__cxx11::string::~string((string *)&local_ad0);
    std::allocator<char>::~allocator(&local_ad1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_af8,"INTO_BASE",&local_af9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b20,"self.0",&local_b21);
    CodeWriter::SetValue(&this->code_,&local_af8,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    std::allocator<char>::~allocator(&local_b21);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator(&local_af9);
    std::__cxx11::string::~string((string *)local_548);
    std::__cxx11::string::~string(local_490);
  }
  if (((((this->super_BaseGenerator).parser_)->opts).rust_serialize & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b48,"impl Serialize for {{ENUM_TY}} {",&local_b49);
    CodeWriter::operator+=(&this->code_,&local_b48);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator(&local_b49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b70,
               "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>",&local_b71);
    CodeWriter::operator+=(&this->code_,&local_b70);
    std::__cxx11::string::~string((string *)&local_b70);
    std::allocator<char>::~allocator(&local_b71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b98,"  where",&local_b99);
    CodeWriter::operator+=(&this->code_,&local_b98);
    std::__cxx11::string::~string((string *)&local_b98);
    std::allocator<char>::~allocator(&local_b99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bc0,"    S: Serializer,",&local_bc1);
    CodeWriter::operator+=(&this->code_,&local_bc0);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::allocator<char>::~allocator(&local_bc1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_be8,"  {",&local_be9);
    CodeWriter::operator+=(&this->code_,&local_be8);
    std::__cxx11::string::~string((string *)&local_be8);
    std::allocator<char>::~allocator(&local_be9);
    bVar2 = anon_unknown_26::IsBitFlagsEnum(pEStack_18);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c10,"    serializer.serialize_u32(self.bits() as u32)",&local_c11)
      ;
      CodeWriter::operator+=(&this->code_,&local_c10);
      std::__cxx11::string::~string((string *)&local_c10);
      std::allocator<char>::~allocator(&local_c11);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c38,
                 "    serializer.serialize_unit_variant(\"{{ENUM_TY}}\", self.0 as u32, self.variant_name().unwrap())"
                 ,&local_c39);
      CodeWriter::operator+=(&this->code_,&local_c38);
      std::__cxx11::string::~string((string *)&local_c38);
      std::allocator<char>::~allocator(&local_c39);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c60,"  }",&local_c61);
    CodeWriter::operator+=(&this->code_,&local_c60);
    std::__cxx11::string::~string((string *)&local_c60);
    std::allocator<char>::~allocator(&local_c61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,"}",&local_c89);
    CodeWriter::operator+=(&this->code_,&local_c88);
    std::__cxx11::string::~string((string *)&local_c88);
    std::allocator<char>::~allocator(&local_c89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_cb0,"",&local_cb1);
    CodeWriter::operator+=(&this->code_,&local_cb0);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::allocator<char>::~allocator(&local_cb1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,"impl<\'a> flatbuffers::Follow<\'a> for {{ENUM_TY}} {",&local_cd9)
  ;
  CodeWriter::operator+=(&this->code_,&local_cd8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d00,"  type Inner = Self;",&local_d01);
  CodeWriter::operator+=(&this->code_,&local_d00);
  std::__cxx11::string::~string((string *)&local_d00);
  std::allocator<char>::~allocator(&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"  #[inline]",&local_d29);
  CodeWriter::operator+=(&this->code_,&local_d28);
  std::__cxx11::string::~string((string *)&local_d28);
  std::allocator<char>::~allocator(&local_d29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d50,"  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {",
             &local_d51);
  CodeWriter::operator+=(&this->code_,&local_d50);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator(&local_d51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d78,
             "    let b = flatbuffers::read_scalar_at::<{{BASE_TYPE}}>(buf, loc);",&local_d79);
  CodeWriter::operator+=(&this->code_,&local_d78);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator(&local_d79);
  bVar2 = anon_unknown_26::IsBitFlagsEnum(pEStack_18);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_da0,"    Self::from_bits_retain(b)",&local_da1);
    CodeWriter::operator+=(&this->code_,&local_da0);
    std::__cxx11::string::~string((string *)&local_da0);
    std::allocator<char>::~allocator(&local_da1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc8,"    Self(b)",&local_dc9);
    CodeWriter::operator+=(&this->code_,&local_dc8);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::allocator<char>::~allocator(&local_dc9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_df0,"  }",&local_df1);
  CodeWriter::operator+=(&this->code_,&local_df0);
  std::__cxx11::string::~string((string *)&local_df0);
  std::allocator<char>::~allocator(&local_df1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e18,"}",&local_e19);
  CodeWriter::operator+=(&this->code_,&local_e18);
  std::__cxx11::string::~string((string *)&local_e18);
  std::allocator<char>::~allocator(&local_e19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e40,"",&local_e41);
  CodeWriter::operator+=(&this->code_,&local_e40);
  std::__cxx11::string::~string((string *)&local_e40);
  std::allocator<char>::~allocator(&local_e41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e68,"impl flatbuffers::Push for {{ENUM_TY}} {",&local_e69);
  CodeWriter::operator+=(&this->code_,&local_e68);
  std::__cxx11::string::~string((string *)&local_e68);
  std::allocator<char>::~allocator(&local_e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e90,"    type Output = {{ENUM_TY}};",&local_e91);
  CodeWriter::operator+=(&this->code_,&local_e90);
  std::__cxx11::string::~string((string *)&local_e90);
  std::allocator<char>::~allocator(&local_e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_eb8,"    #[inline]",&local_eb9);
  CodeWriter::operator+=(&this->code_,&local_eb8);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ee0,"    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {"
             ,&local_ee1);
  CodeWriter::operator+=(&this->code_,&local_ee0);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::allocator<char>::~allocator(&local_ee1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f08,
             "        flatbuffers::emplace_scalar::<{{BASE_TYPE}}>(dst, {{INTO_BASE}});",&local_f09)
  ;
  CodeWriter::operator+=(&this->code_,&local_f08);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator(&local_f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f30,"    }",&local_f31);
  CodeWriter::operator+=(&this->code_,&local_f30);
  std::__cxx11::string::~string((string *)&local_f30);
  std::allocator<char>::~allocator(&local_f31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f58,"}",&local_f59);
  CodeWriter::operator+=(&this->code_,&local_f58);
  std::__cxx11::string::~string((string *)&local_f58);
  std::allocator<char>::~allocator(&local_f59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f80,"",&local_f81);
  CodeWriter::operator+=(&this->code_,&local_f80);
  std::__cxx11::string::~string((string *)&local_f80);
  std::allocator<char>::~allocator(&local_f81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"impl flatbuffers::EndianScalar for {{ENUM_TY}} {",&local_fa9);
  CodeWriter::operator+=(&this->code_,&local_fa8);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator(&local_fa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fd0,"  type Scalar = {{BASE_TYPE}};",&local_fd1);
  CodeWriter::operator+=(&this->code_,&local_fd0);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::allocator<char>::~allocator(&local_fd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ff8,"  #[inline]",&local_ff9);
  CodeWriter::operator+=(&this->code_,&local_ff8);
  std::__cxx11::string::~string((string *)&local_ff8);
  std::allocator<char>::~allocator(&local_ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1020,"  fn to_little_endian(self) -> {{BASE_TYPE}} {",&local_1021);
  CodeWriter::operator+=(&this->code_,&local_1020);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator(&local_1021);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1048,"    {{INTO_BASE}}.to_le()",&local_1049);
  CodeWriter::operator+=(&this->code_,&local_1048);
  std::__cxx11::string::~string((string *)&local_1048);
  std::allocator<char>::~allocator(&local_1049);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1070,"  }",&local_1071);
  CodeWriter::operator+=(&this->code_,&local_1070);
  std::__cxx11::string::~string((string *)&local_1070);
  std::allocator<char>::~allocator(&local_1071);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1098,"  #[inline]",&local_1099);
  CodeWriter::operator+=(&this->code_,&local_1098);
  std::__cxx11::string::~string((string *)&local_1098);
  std::allocator<char>::~allocator(&local_1099);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10c0,"  #[allow(clippy::wrong_self_convention)]",&local_10c1);
  CodeWriter::operator+=(&this->code_,&local_10c0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::allocator<char>::~allocator(&local_10c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10e8,"  fn from_little_endian(v: {{BASE_TYPE}}) -> Self {",&local_10e9
            );
  CodeWriter::operator+=(&this->code_,&local_10e8);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::allocator<char>::~allocator(&local_10e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1110,"    let b = {{BASE_TYPE}}::from_le(v);",&local_1111);
  CodeWriter::operator+=(&this->code_,&local_1110);
  std::__cxx11::string::~string((string *)&local_1110);
  std::allocator<char>::~allocator(&local_1111);
  bVar2 = anon_unknown_26::IsBitFlagsEnum(pEStack_18);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1138,"    Self::from_bits_retain(b)",&local_1139);
    CodeWriter::operator+=(&this->code_,&local_1138);
    std::__cxx11::string::~string((string *)&local_1138);
    std::allocator<char>::~allocator(&local_1139);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1160,"    Self(b)",&local_1161);
    CodeWriter::operator+=(&this->code_,&local_1160);
    std::__cxx11::string::~string((string *)&local_1160);
    std::allocator<char>::~allocator(&local_1161);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1188,"  }",&local_1189);
  CodeWriter::operator+=(&this->code_,&local_1188);
  std::__cxx11::string::~string((string *)&local_1188);
  std::allocator<char>::~allocator(&local_1189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11b0,"}",&local_11b1);
  CodeWriter::operator+=(&this->code_,&local_11b0);
  std::__cxx11::string::~string((string *)&local_11b0);
  std::allocator<char>::~allocator(&local_11b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11d8,"",&local_11d9);
  CodeWriter::operator+=(&this->code_,&local_11d8);
  std::__cxx11::string::~string((string *)&local_11d8);
  std::allocator<char>::~allocator(&local_11d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1200,"impl<\'a> flatbuffers::Verifiable for {{ENUM_TY}} {",&local_1201
            );
  CodeWriter::operator+=(&this->code_,&local_1200);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator(&local_1201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1228,"  #[inline]",&local_1229);
  CodeWriter::operator+=(&this->code_,&local_1228);
  std::__cxx11::string::~string((string *)&local_1228);
  std::allocator<char>::~allocator(&local_1229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1250,"  fn run_verifier(",&local_1251);
  CodeWriter::operator+=(&this->code_,&local_1250);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator(&local_1251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1278,"    v: &mut flatbuffers::Verifier, pos: usize",&local_1279);
  CodeWriter::operator+=(&this->code_,&local_1278);
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator(&local_1279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12a0,"  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {",&local_12a1
            );
  CodeWriter::operator+=(&this->code_,&local_12a0);
  std::__cxx11::string::~string((string *)&local_12a0);
  std::allocator<char>::~allocator(&local_12a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12c8,"    use self::flatbuffers::Verifiable;",&local_12c9);
  CodeWriter::operator+=(&this->code_,&local_12c8);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::allocator<char>::~allocator(&local_12c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12f0,"    {{BASE_TYPE}}::run_verifier(v, pos)",&local_12f1);
  CodeWriter::operator+=(&this->code_,&local_12f0);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::allocator<char>::~allocator(&local_12f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1318,"  }",&local_1319);
  CodeWriter::operator+=(&this->code_,&local_1318);
  std::__cxx11::string::~string((string *)&local_1318);
  std::allocator<char>::~allocator(&local_1319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1340,"}",&local_1341);
  CodeWriter::operator+=(&this->code_,&local_1340);
  std::__cxx11::string::~string((string *)&local_1340);
  std::allocator<char>::~allocator(&local_1341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1368,"",&local_1369);
  CodeWriter::operator+=(&this->code_,&local_1368);
  std::__cxx11::string::~string((string *)&local_1368);
  std::allocator<char>::~allocator(&local_1369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1390,"impl flatbuffers::SimpleToVerifyInSlice for {{ENUM_TY}} {}",
             &local_1391);
  CodeWriter::operator+=(&this->code_,&local_1390);
  std::__cxx11::string::~string((string *)&local_1390);
  std::allocator<char>::~allocator(&local_1391);
  if ((pEStack_18->is_union & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13b8,"UNION_TYPE",&local_13b9);
    IdlNamer::Type_abi_cxx11_(&local_13e0,&this->namer_,pEStack_18);
    CodeWriter::SetValue(&this->code_,&local_13b8,&local_13e0);
    std::__cxx11::string::~string((string *)&local_13e0);
    std::__cxx11::string::~string((string *)&local_13b8);
    std::allocator<char>::~allocator(&local_13b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1400,"{{ACCESS_TYPE}} struct {{UNION_TYPE}}UnionTableOffset {}",
               &local_1401);
    CodeWriter::operator+=(&this->code_,&local_1400);
    std::__cxx11::string::~string((string *)&local_1400);
    std::allocator<char>::~allocator(&local_1401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1428,"",&local_1429);
    CodeWriter::operator+=(&this->code_,&local_1428);
    std::__cxx11::string::~string((string *)&local_1428);
    std::allocator<char>::~allocator(&local_1429);
    if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
      GenUnionObject(this,pEStack_18);
    }
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def) {
    const bool is_private = parser_.opts.no_leak_private_annotations &&
                            (enum_def.attributes.Lookup("private") != nullptr);
    code_.SetValue("ACCESS_TYPE", is_private ? "pub(crate)" : "pub");
    code_.SetValue("ENUM_TY", namer_.Type(enum_def));
    code_.SetValue("BASE_TYPE", GetEnumTypeForDecl(enum_def.underlying_type));
    code_.SetValue("ENUM_NAMESPACE", namer_.Namespace(enum_def.name));
    code_.SetValue("ENUM_CONSTANT", namer_.Constant(enum_def.name));
    const EnumVal *minv = enum_def.MinValue();
    const EnumVal *maxv = enum_def.MaxValue();
    FLATBUFFERS_ASSERT(minv && maxv);
    code_.SetValue("ENUM_MIN_BASE_VALUE", enum_def.ToString(*minv));
    code_.SetValue("ENUM_MAX_BASE_VALUE", enum_def.ToString(*maxv));

    if (IsBitFlagsEnum(enum_def)) {
      // Defer to the convenient and canonical bitflags crate. We declare it in
      // a module to #allow camel case constants in a smaller scope. This
      // matches Flatbuffers c-modeled enums where variants are associated
      // constants but in camel case.
      code_ += "#[allow(non_upper_case_globals)]";
      code_ += "mod bitflags_{{ENUM_NAMESPACE}} {";
      code_ += "  flatbuffers::bitflags::bitflags! {";
      GenComment(enum_def.doc_comment, "    ");
      code_ += "    #[derive(Default, Debug, Clone, Copy, PartialEq)]";
      code_ += "    {{ACCESS_TYPE}} struct {{ENUM_TY}}: {{BASE_TYPE}} {";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        this->GenComment(ev.doc_comment, "    ");
        code_ += "    const {{VARIANT}} = {{VALUE}};";
      });
      code_ += "    }";
      code_ += "  }";
      code_ += "}";
      code_ += "pub use self::bitflags_{{ENUM_NAMESPACE}}::{{ENUM_TY}};";
      code_ += "";

      code_.SetValue("INTO_BASE", "self.bits()");
    } else {
      // Normal, c-modelled enums.
      // Deprecated associated constants;
      const std::string deprecation_warning =
          "#[deprecated(since = \"2.0.0\", note = \"Use associated constants"
          " instead. This will no longer be generated in 2021.\")]";
      code_ += deprecation_warning;
      code_ +=
          "pub const ENUM_MIN_{{ENUM_CONSTANT}}: {{BASE_TYPE}}"
          " = {{ENUM_MIN_BASE_VALUE}};";
      code_ += deprecation_warning;
      code_ +=
          "pub const ENUM_MAX_{{ENUM_CONSTANT}}: {{BASE_TYPE}}"
          " = {{ENUM_MAX_BASE_VALUE}};";
      auto num_fields = NumToString(enum_def.size());
      code_ += deprecation_warning;
      code_ += "#[allow(non_camel_case_types)]";
      code_ += "pub const ENUM_VALUES_{{ENUM_CONSTANT}}: [{{ENUM_TY}}; " +
               num_fields + "] = [";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        code_ += namer_.EnumVariant(enum_def, ev) + ",";
      });
      code_ += "];";
      code_ += "";

      GenComment(enum_def.doc_comment);
      // Derive Default to be 0. flatc enforces this when the enum
      // is put into a struct, though this isn't documented behavior, it is
      // needed to derive defaults in struct objects.
      code_ +=
          "#[derive(Clone, Copy, PartialEq, Eq, PartialOrd, Ord, Hash, "
          "Default)]";
      code_ += "#[repr(transparent)]";
      code_ += "{{ACCESS_TYPE}} struct {{ENUM_TY}}(pub {{BASE_TYPE}});";
      code_ += "#[allow(non_upper_case_globals)]";
      code_ += "impl {{ENUM_TY}} {";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        this->GenComment(ev.doc_comment);
        code_ += "pub const {{VARIANT}}: Self = Self({{VALUE}});";
      });
      code_ += "";
      // Generate Associated constants
      code_ += "  pub const ENUM_MIN: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};";
      code_ += "  pub const ENUM_MAX: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};";
      code_ += "  pub const ENUM_VALUES: &'static [Self] = &[";
      ForAllEnumValues(enum_def, [&]() { code_ += "  Self::{{VARIANT}},"; });
      code_ += "  ];";
      code_ += "  /// Returns the variant's name or \"\" if unknown.";
      code_ += "  pub fn variant_name(self) -> Option<&'static str> {";
      code_ += "    match self {";
      ForAllEnumValues(enum_def, [&]() {
        code_ += "    Self::{{VARIANT}} => Some(\"{{VARIANT}}\"),";
      });
      code_ += "      _ => None,";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      // Generate Debug. Unknown variants are printed like "<UNKNOWN 42>".
      code_ += "impl core::fmt::Debug for {{ENUM_TY}} {";
      code_ +=
          "  fn fmt(&self, f: &mut core::fmt::Formatter) ->"
          " core::fmt::Result {";
      code_ += "    if let Some(name) = self.variant_name() {";
      code_ += "      f.write_str(name)";
      code_ += "    } else {";
      code_ += "      f.write_fmt(format_args!(\"<UNKNOWN {:?}>\", self.0))";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      code_.SetValue("INTO_BASE", "self.0");
    }

    // Implement serde::Serialize
    if (parser_.opts.rust_serialize) {
      code_ += "impl Serialize for {{ENUM_TY}} {";
      code_ +=
          "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>";
      code_ += "  where";
      code_ += "    S: Serializer,";
      code_ += "  {";
      if (IsBitFlagsEnum(enum_def)) {
        code_ += "    serializer.serialize_u32(self.bits() as u32)";
      } else {
        code_ +=
            "    serializer.serialize_unit_variant(\"{{ENUM_TY}}\", self.0 "
            "as "
            "u32, self.variant_name().unwrap())";
      }
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }

    // Generate Follow and Push so we can serialize and stuff.
    code_ += "impl<'a> flatbuffers::Follow<'a> for {{ENUM_TY}} {";
    code_ += "  type Inner = Self;";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ +=
        "    let b = flatbuffers::read_scalar_at::<{{BASE_TYPE}}>(buf, loc);";
    if (IsBitFlagsEnum(enum_def)) {
      code_ += "    Self::from_bits_retain(b)";
    } else {
      code_ += "    Self(b)";
    }
    code_ += "  }";
    code_ += "}";
    code_ += "";
    code_ += "impl flatbuffers::Push for {{ENUM_TY}} {";
    code_ += "    type Output = {{ENUM_TY}};";
    code_ += "    #[inline]";
    code_ += "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {";
    code_ +=
        "        flatbuffers::emplace_scalar::<{{BASE_TYPE}}>(dst, "
        "{{INTO_BASE}});";
    code_ += "    }";
    code_ += "}";
    code_ += "";
    code_ += "impl flatbuffers::EndianScalar for {{ENUM_TY}} {";
    code_ += "  type Scalar = {{BASE_TYPE}};";
    code_ += "  #[inline]";
    code_ += "  fn to_little_endian(self) -> {{BASE_TYPE}} {";
    code_ += "    {{INTO_BASE}}.to_le()";
    code_ += "  }";
    code_ += "  #[inline]";
    code_ += "  #[allow(clippy::wrong_self_convention)]";
    code_ += "  fn from_little_endian(v: {{BASE_TYPE}}) -> Self {";
    code_ += "    let b = {{BASE_TYPE}}::from_le(v);";
    if (IsBitFlagsEnum(enum_def)) {
      code_ += "    Self::from_bits_retain(b)";
    } else {
      code_ += "    Self(b)";
    }
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Generate verifier - deferring to the base type.
    code_ += "impl<'a> flatbuffers::Verifiable for {{ENUM_TY}} {";
    code_ += "  #[inline]";
    code_ += "  fn run_verifier(";
    code_ += "    v: &mut flatbuffers::Verifier, pos: usize";
    code_ += "  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {";
    code_ += "    use self::flatbuffers::Verifiable;";
    code_ += "    {{BASE_TYPE}}::run_verifier(v, pos)";
    code_ += "  }";
    code_ += "}";
    code_ += "";
    // Enums are basically integers.
    code_ += "impl flatbuffers::SimpleToVerifyInSlice for {{ENUM_TY}} {}";

    if (enum_def.is_union) {
      // Generate typesafe offset(s) for unions
      code_.SetValue("UNION_TYPE", namer_.Type(enum_def));
      code_ += "{{ACCESS_TYPE}} struct {{UNION_TYPE}}UnionTableOffset {}";
      code_ += "";
      if (parser_.opts.generate_object_based_api) { GenUnionObject(enum_def); }
    }
  }